

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  ImDrawCmd *pIVar1;
  long lVar2;
  
  pIVar1 = (this->CmdBuffer).Data;
  lVar2 = (long)(this->CmdBuffer).Size;
  if (pIVar1[lVar2 + -1].UserCallback == (ImDrawCallback)0x0) {
    pIVar1 = pIVar1 + lVar2;
    if (pIVar1[-1].ElemCount != 0) {
      AddDrawCmd(this);
      pIVar1 = (this->CmdBuffer).Data + (this->CmdBuffer).Size;
    }
    pIVar1[-1].UserCallback = callback;
    pIVar1[-1].UserCallbackData = callback_data;
    AddDrawCmd(this);
    return;
  }
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_draw.cpp"
                ,0x1ce,"void ImDrawList::AddCallback(ImDrawCallback, void *)");
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    }
    curr_cmd->UserCallback = callback;
    curr_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}